

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_iterative.c
# Opt level: O2

int SUNQRAdd_ICWY(N_Vector *Q,realtype *R,N_Vector df,int m,int mMax,void *QRdata)

{
  realtype *dotprods;
  int iVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  realtype rVar5;
  double dVar6;
  
  N_VScale(1.0,df,*QRdata);
  if (0 < m) {
    iVar1 = (m - 1U) * mMax;
    N_VDotProdMulti(m,Q[m - 1U],Q,(realtype *)((long)iVar1 * 8 + *(long *)((long)QRdata + 0x10)));
    *(undefined8 *)(*(long *)((long)QRdata + 0x10) + (long)(m + iVar1 + -1) * 8) =
         0x3ff0000000000000;
    dotprods = R + mMax * m;
    N_VDotProdMulti(m,*QRdata,Q,dotprods);
    iVar1 = 1;
    for (uVar2 = 0; uVar2 != (uint)m; uVar2 = uVar2 + 1) {
      lVar3 = (long)iVar1;
      lVar4 = mMax * lVar3 + uVar2;
      for (; lVar3 < (long)(ulong)(uint)m; lVar3 = lVar3 + 1) {
        dotprods[lVar3] =
             dotprods[lVar3] -
             dotprods[uVar2] * *(double *)(*(long *)((long)QRdata + 0x10) + lVar4 * 8);
        lVar4 = lVar4 + mMax;
      }
      iVar1 = iVar1 + 1;
    }
    N_VLinearCombination(m,dotprods,Q,*(N_Vector *)((long)QRdata + 8));
    N_VLinearSum(1.0,*QRdata,-1.0,*(N_Vector *)((long)QRdata + 8),*QRdata);
  }
  rVar5 = N_VDotProd(*QRdata,*QRdata);
  dVar6 = 0.0;
  if (0.0 < rVar5) {
    rVar5 = N_VDotProd(*QRdata,*QRdata);
    if (rVar5 < 0.0) {
      dVar6 = sqrt(rVar5);
    }
    else {
      dVar6 = SQRT(rVar5);
    }
  }
  R[(mMax + 1) * m] = dVar6;
  N_VScale(1.0 / dVar6,*QRdata,Q[m]);
  return 0;
}

Assistant:

int SUNQRAdd_ICWY(N_Vector *Q, realtype *R, N_Vector df,
                  int m, int mMax, void *QRdata)
{
    sunindextype j, k;
    SUNQRData qrdata = (SUNQRData) QRdata;

    N_VScale(ONE, df, qrdata->vtemp); /* stores d_fi in temp */

    if (m > 0) {
      /* T(1:k-1,k-1)^T = Q(:,1:k-1)^T * Q(:,k-1) */
      N_VDotProdMulti(m, Q[m-1], Q, qrdata->temp_array + (m-1) * mMax);

      /* T(k-1,k-1) = 1.0 */
      qrdata->temp_array[(m-1) * mMax + (m-1)] = ONE;

      /* R(1:k-1,k) = Q_k-1^T * df */
      N_VDotProdMulti(m, qrdata->vtemp, Q, R + m * mMax );

      /* Solve T^T * R(1:k-1,k) = R(1:k-1,k) */
      for (k = 0; k < m; k++) {
        /* Skip setting the diagonal element because it doesn't change */
        for (j = k+1; j < m; j++) {
          R[m * mMax + j] -= R[m * mMax + k] * qrdata->temp_array[j * mMax + k];
        }
      }
      /* end */

      /* Q(:,k-1) = df - Q_k-1 R(1:k-1,k) */
      N_VLinearCombination(m, R + m * mMax, Q, qrdata->vtemp2);
      N_VLinearSum(ONE, qrdata->vtemp, -ONE, qrdata->vtemp2, qrdata->vtemp);
    }

    /* R(k,k) = \| df \| */
    R[m * mMax + m] = SUNRsqrt(N_VDotProd(qrdata->vtemp, qrdata->vtemp));
    /* Q(:,k) = df / \| df \| */
    N_VScale((1/R[m * mMax + m]), qrdata->vtemp, Q[m]);

    /* Return success */
    return 0;
}